

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sclBufSize.c
# Opt level: O2

void Abc_SclBufSize(Bus_Man_t *p,float Gain)

{
  int iVar1;
  uint uVar2;
  int iVar3;
  abctime aVar4;
  Abc_Obj_t *pAVar5;
  Abc_Obj_t *pAVar6;
  SC_Cell *pSVar7;
  SC_BusPars *pSVar8;
  SC_Cell *p_00;
  SC_Timing *pSVar9;
  abctime aVar10;
  Vec_Ptr_t *pVVar11;
  int i;
  int iVar12;
  Bus_Man_t *pBVar13;
  float fVar14;
  float fVar15;
  double dVar16;
  SC_Pair ArrOut1;
  SC_Pair ArrOut0;
  SC_Pair LoadIn;
  SC_Pair local_58;
  SC_Pair local_50;
  SC_Pair SlewIn;
  SC_Pair ArrIn;
  SC_Pair LoadIn_1;
  
  aVar4 = Abc_Clock();
  iVar1 = p->pNtk->vObjs->nSize;
  if (p->pPars->fAddBufs != 0) {
    Gain = Gain * Gain;
  }
  iVar12 = iVar1;
LAB_003addca:
  do {
    if (iVar12 < 1) {
      fVar14 = 0.0;
      for (iVar12 = 0; pVVar11 = p->pNtk->vCis, iVar12 < pVVar11->nSize; iVar12 = iVar12 + 1) {
        pAVar5 = (Abc_Obj_t *)Vec_PtrEntry(pVVar11,iVar12);
        fVar15 = Abc_NtkComputeNodeDeparture(pAVar5,(float)p->pPars->Slew);
        if (p->pPiDrive != (SC_Cell *)0x0) {
          LoadIn.rise = Bus_SclObjLoad(pAVar5);
          pSVar7 = p->pPiDrive;
          LoadIn_1.rise = 0.0;
          LoadIn_1.fall = 0.0;
          ArrIn.rise = 0.0;
          ArrIn.fall = 0.0;
          SlewIn.rise = 0.0;
          SlewIn.fall = 0.0;
          ArrOut0.rise = 0.0;
          ArrOut0.fall = 0.0;
          ArrOut1.rise = 0.0;
          ArrOut1.fall = 0.0;
          local_50.rise = 0.0;
          local_50.fall = 0.0;
          local_58.rise = 0.0;
          local_58.fall = 0.0;
          LoadIn.fall = LoadIn.rise;
          if (pSVar7->n_inputs != 1) {
            __assert_fail("pCell->n_inputs == 1",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/map/scl/sclLib.h"
                          ,0x2af,
                          "void Scl_LibHandleInputDriver(SC_Cell *, SC_Pair *, SC_Pair *, SC_Pair *)"
                         );
          }
          pSVar9 = Scl_CellPinTime(pSVar7,0);
          Scl_LibPinArrival(pSVar9,&ArrIn,&SlewIn,&LoadIn_1,&ArrOut0,&local_50);
          pSVar9 = Scl_CellPinTime(pSVar7,0);
          Scl_LibPinArrival(pSVar9,&ArrIn,&SlewIn,&LoadIn,&ArrOut1,&local_58);
          fVar15 = fVar15 + (ArrOut1.fall - ArrOut0.fall) * 0.5 +
                            (ArrOut1.rise - ArrOut0.rise) * 0.5;
        }
        if (fVar14 <= fVar15) {
          fVar14 = fVar15;
        }
      }
      dVar16 = (double)fVar14;
LAB_003ae1dd:
      pSVar8 = p->pPars;
      if (pSVar8->fVerbose == 0) {
        return;
      }
      iVar12 = 0x7e0a05;
      printf("WireLoads = %d  Degree = %d  Target slew =%4d ps   Gain2 =%5d  Buf = %6d  Delay =%7.0f ps   "
             ,dVar16,(ulong)(uint)pSVar8->fUseWireLoads,(ulong)(uint)pSVar8->nDegree,
             (ulong)(uint)pSVar8->Slew,(ulong)(uint)pSVar8->GainRatio,
             (ulong)(uint)(p->pNtk->vObjs->nSize - iVar1));
      aVar10 = Abc_Clock();
      Abc_Print(iVar12,"%s =","Time");
      Abc_Print(iVar12,"%9.2f sec\n",(double)(aVar10 - aVar4) / 1000000.0);
      return;
    }
    iVar12 = iVar12 + -1;
    pAVar5 = Abc_NtkObj(p->pNtk,iVar12);
  } while (pAVar5 == (Abc_Obj_t *)0x0);
  uVar2 = *(uint *)&pAVar5->field_0x14 & 0xf;
  if ((uVar2 == 2) || (uVar2 == 5)) {
    if (p->pPiDrive == (SC_Cell *)0x0) goto LAB_003addca;
  }
  else if ((uVar2 != 7) || ((pAVar5->vFanins).nSize < 1)) goto LAB_003addca;
  if (iVar1 * 2 < p->pNtk->vObjs->nSize) {
    printf("Buffering could not be completed because the gain value (%d) is too low.\n",
           (ulong)(uint)p->pPars->GainRatio);
    dVar16 = 0.0;
    goto LAB_003ae1dd;
  }
  Abc_NtkComputeFanoutInfo(pAVar5,(float)p->pPars->Slew);
  fVar14 = Abc_NtkComputeNodeLoad(p,pAVar5);
  uVar2 = *(uint *)&pAVar5->field_0x14 & 0xf;
  if (((uVar2 == 2) || (uVar2 == 5)) || (iVar3 = Abc_ObjIsBarBuf(pAVar5), iVar3 != 0)) {
    pSVar7 = p->pPiDrive;
    p_00 = pSVar7;
    if (pSVar7 != (SC_Cell *)0x0) goto LAB_003ade78;
    p_00 = (SC_Cell *)0x0;
    fVar15 = fVar14;
  }
  else {
    p_00 = Abc_SclObjCell(pAVar5);
    pSVar7 = p_00->pAve;
LAB_003ade78:
    fVar15 = SC_CellPinCapAve(pSVar7);
  }
  if ((p->pPars->fSizeOnly == 0) &&
     ((p->pPars->nDegree < (pAVar5->vFanouts).nSize || (fVar15 * Gain < fVar14)))) {
    Abc_NodeCollectFanouts(pAVar5,p->vFanouts);
    pVVar11 = p->vFanouts;
    if (1 < (long)pVVar11->nSize) {
      qsort(pVVar11->pArray,(long)pVVar11->nSize,8,Bus_SclCompareFanouts);
      pVVar11 = p->vFanouts;
    }
    pSVar8 = p->pPars;
    do {
      if (pSVar8->fVeryVerbose != 0) {
        Abc_NtkPrintFanoutProfileVec(pAVar5,pVVar11);
        pVVar11 = p->vFanouts;
      }
      pBVar13 = p;
      pAVar6 = Abc_SclAddOneInv(p,pAVar5,pVVar11,Gain);
      if (p->pPars->fVeryVerbose != 0) {
        Abc_SclOneNodePrint(pBVar13,pAVar6);
      }
      Bus_SclInsertFanout(p->vFanouts,pAVar6);
      fVar14 = Abc_NtkComputeFanoutLoad(p,p->vFanouts);
      pSVar8 = p->pPars;
      pVVar11 = p->vFanouts;
      iVar3 = pVVar11->nSize;
    } while ((pSVar8->nDegree < iVar3) || ((1 < iVar3 && (fVar15 * Gain < fVar14))));
    for (i = 0; i < iVar3; i = i + 1) {
      pAVar6 = (Abc_Obj_t *)Vec_PtrEntry(pVVar11,i);
      if ((pAVar6->vFanins).nSize == 0) {
        Abc_ObjAddFanin(pAVar6,pAVar5);
      }
      pVVar11 = p->vFanouts;
      iVar3 = pVVar11->nSize;
    }
    Bus_SclObjSetLoad(pAVar5,0.0);
    fVar15 = Abc_NtkComputeNodeLoad(p,pAVar5);
    if ((1.0 <= fVar15 - fVar14) || (1.0 <= fVar14 - fVar15)) {
      __assert_fail("LoadNew - Load < 1 && Load - LoadNew < 1",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/map/scl/sclBufSize.c"
                    ,0x1c9,"void Abc_SclBufSize(Bus_Man_t *, float)");
    }
  }
  uVar2 = *(uint *)&pAVar5->field_0x14 & 0xf;
  if ((uVar2 != 2) && (uVar2 != 5)) {
    Abc_NtkComputeNodeDeparture(pAVar5,(float)p->pPars->Slew);
    iVar3 = Abc_ObjIsBarBuf(pAVar5);
    if (iVar3 == 0) {
      pSVar7 = Abc_SclFindSmallestGate(p_00,fVar14 / Gain);
      pBVar13 = (Bus_Man_t *)pAVar5->pNtk->vGates;
      Vec_IntWriteEntry((Vec_Int_t *)pBVar13,pAVar5->Id,pSVar7->Id);
      pSVar8 = p->pPars;
      if (pSVar8->fVeryVerbose != 0) {
        Abc_SclOneNodePrint(pBVar13,pAVar5);
        pSVar8 = p->pPars;
      }
      if ((pSVar8->fSizeOnly == 0) && (pSVar8->nDegree < (pAVar5->vFanouts).nSize)) {
        __assert_fail("p->pPars->fSizeOnly || Abc_ObjFanoutNum(pObj) <= p->pPars->nDegree",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/map/scl/sclBufSize.c"
                      ,0x1d5,"void Abc_SclBufSize(Bus_Man_t *, float)");
      }
    }
  }
  goto LAB_003addca;
}

Assistant:

void Abc_SclBufSize( Bus_Man_t * p, float Gain )
{
    SC_Cell * pCell, * pCellNew;
    Abc_Obj_t * pObj, * pFanout;
    abctime clk = Abc_Clock();
    int i, k, nObjsOld = Abc_NtkObjNumMax(p->pNtk);
    float GainGate, GainInv, Load, LoadNew, Cin, DeptMax = 0;
    GainGate = p->pPars->fAddBufs ? (float)pow( (double)Gain, (double)2.0 ) : Gain;
    GainInv  = p->pPars->fAddBufs ? (float)pow( (double)Gain, (double)2.0 ) : Gain;
    Abc_NtkForEachObjReverse( p->pNtk, pObj, i )
    {
        if ( !((Abc_ObjIsNode(pObj) && Abc_ObjFaninNum(pObj) > 0) || (Abc_ObjIsCi(pObj) && p->pPiDrive)) )
            continue;
        if ( 2 * nObjsOld < Abc_NtkObjNumMax(p->pNtk) )
        {
            printf( "Buffering could not be completed because the gain value (%d) is too low.\n", p->pPars->GainRatio );
            break;
        }
        // compute load
        Abc_NtkComputeFanoutInfo( pObj, p->pPars->Slew );
        Load = Abc_NtkComputeNodeLoad( p, pObj );
        // consider the gate
        if ( Abc_ObjIsCi(pObj) || Abc_ObjIsBarBuf(pObj) )
        {
            pCell = p->pPiDrive;
            // if PI driver is not given, assume Cin to be equal to Load
            // this way, buffering of the PIs is performed
            Cin = pCell ? SC_CellPinCapAve(pCell) : Load;
        }
        else
        {
            pCell = Abc_SclObjCell( pObj );
            Cin = SC_CellPinCapAve( pCell->pAve );
//        Cin = SC_CellPinCapAve( pCell->pRepr->pNext );
        }
        // consider buffering this gate
        if ( !p->pPars->fSizeOnly && (Abc_ObjFanoutNum(pObj) > p->pPars->nDegree || Load > GainGate * Cin) )
        {
            // add one or more inverters
//            Abc_NtkPrintFanoutProfile( pObj );
            Abc_NodeCollectFanouts( pObj, p->vFanouts );
            Vec_PtrSort( p->vFanouts, (int(*)(void))Bus_SclCompareFanouts );
            do 
            {
                Abc_Obj_t * pInv;
                if ( p->pPars->fVeryVerbose )//|| Vec_PtrSize(p->vFanouts) == Abc_ObjFanoutNum(pObj) )
                    Abc_NtkPrintFanoutProfileVec( pObj, p->vFanouts );
                pInv = Abc_SclAddOneInv( p, pObj, p->vFanouts, GainInv );
                if ( p->pPars->fVeryVerbose )
                    Abc_SclOneNodePrint( p, pInv );
                Bus_SclInsertFanout( p->vFanouts, pInv );
                Load = Abc_NtkComputeFanoutLoad( p, p->vFanouts );
            }
            while ( Vec_PtrSize(p->vFanouts) > p->pPars->nDegree || (Vec_PtrSize(p->vFanouts) > 1 && Load > GainGate * Cin) );
            // update node fanouts
            Vec_PtrForEachEntry( Abc_Obj_t *, p->vFanouts, pFanout, k )
                if ( Abc_ObjFaninNum(pFanout) == 0 )
                    Abc_ObjAddFanin( pFanout, pObj );
            Bus_SclObjSetLoad( pObj, 0 );
            LoadNew = Abc_NtkComputeNodeLoad( p, pObj );
            assert( LoadNew - Load < 1 && Load - LoadNew < 1 );
        } 
        if ( Abc_ObjIsCi(pObj) )
            continue;
        Abc_NtkComputeNodeDeparture( pObj, p->pPars->Slew );
        if ( Abc_ObjIsBarBuf(pObj) )
            continue;
        // create cell
        pCellNew = Abc_SclFindSmallestGate( pCell, Load / GainGate );
        Abc_SclObjSetCell( pObj, pCellNew );
        if ( p->pPars->fVeryVerbose )
            Abc_SclOneNodePrint( p, pObj );
        assert( p->pPars->fSizeOnly || Abc_ObjFanoutNum(pObj) <= p->pPars->nDegree );
    }
    // compute departure time of the PI
    if ( i < 0 ) // finished buffering
    Abc_NtkForEachCi( p->pNtk, pObj, i )
    {
        float DeptCur = Abc_NtkComputeNodeDeparture(pObj, p->pPars->Slew);
        if ( p->pPiDrive )
        {
            float Load = Bus_SclObjLoad( pObj );
            SC_Pair ArrOut, SlewOut, LoadIn = { Load, Load }; 
            Scl_LibHandleInputDriver( p->pPiDrive, &LoadIn, &ArrOut, &SlewOut );
            DeptCur += 0.5 * ArrOut.fall +  0.5 * ArrOut.rise;
        }       
        DeptMax = Abc_MaxFloat( DeptMax, DeptCur );
    }
    if ( p->pPars->fVerbose )
    {
        printf( "WireLoads = %d  Degree = %d  Target slew =%4d ps   Gain2 =%5d  Buf = %6d  Delay =%7.0f ps   ", 
            p->pPars->fUseWireLoads, p->pPars->nDegree, p->pPars->Slew, p->pPars->GainRatio, 
            Abc_NtkObjNumMax(p->pNtk) - nObjsOld, DeptMax );
        Abc_PrintTime( 1, "Time", Abc_Clock() - clk );
    }
}